

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

LogLevel cmake::StringToLogLevel(string *levelStr)

{
  pointer ppVar1;
  bool bVar2;
  int iVar3;
  LogLevel LVar4;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>_>
  __it;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>_>
  __it_00;
  long lVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>_>
  _Var7;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>
  __l;
  string levelStrLowCase;
  allocator_type local_169;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  *local_168;
  LogLevel local_160 [6];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_148;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_120;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_58;
  
  if ((StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_)
     , iVar3 != 0)) {
    local_168 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
                 *)CONCAT44(local_168._4_4_,1);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[6],_cmake::LogLevel,_true>
              (&local_148,(char (*) [6])0x5536b1,(LogLevel *)&local_168);
    local_160[5] = 2;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[8],_cmake::LogLevel,_true>
              (&local_120,(char (*) [8])0x5212e4,local_160 + 5);
    local_160[4] = 3;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[7],_cmake::LogLevel,_true>(&local_f8,(char (*) [7])"notice",local_160 + 4)
    ;
    local_160[3] = 4;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[7],_cmake::LogLevel,_true>(&local_d0,(char (*) [7])0x551024,local_160 + 3)
    ;
    local_160[2] = 5;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[8],_cmake::LogLevel,_true>
              (&local_a8,(char (*) [8])"verbose",local_160 + 2);
    local_160[1] = 6;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[6],_cmake::LogLevel,_true>(&local_80,(char (*) [6])"debug",local_160 + 1);
    local_160[0] = LOG_TRACE;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[6],_cmake::LogLevel,_true>(&local_58,(char (*) [6])0x522dae,local_160);
    __l._M_len = 7;
    __l._M_array = &local_148;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
    ::vector(&StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_,__l,&local_169);
    lVar5 = -0x118;
    paVar6 = &local_58.first.field_2;
    do {
      if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar6->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar6->_M_allocated_capacity)[-2],
                        paVar6->_M_allocated_capacity + 1);
      }
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar6->_M_allocated_capacity + -5);
      lVar5 = lVar5 + 0x28;
    } while (lVar5 != 0);
    __cxa_atexit(std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
                 ::~vector,&StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_);
  }
  cmsys::SystemTools::LowerCase(&local_148.first,levelStr);
  ppVar1 = StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = ((long)StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 >> 2;
  __it_00._M_current =
       StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_168 = &local_148;
  if (0 < lVar5) {
    __it_00._M_current =
         StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
         ._M_impl.super__Vector_impl_data._M_start + lVar5 * 4;
    lVar5 = lVar5 + 1;
    __it._M_current =
         StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmake::StringToLogLevel(std::__cxx11::string_const&)::$_0>::operator()
                        ((_Iter_pred<cmake::StringToLogLevel(std::__cxx11::string_const&)::__0> *)
                         &local_168,__it);
      _Var7._M_current = __it._M_current;
      if (bVar2) goto LAB_001c6576;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmake::StringToLogLevel(std::__cxx11::string_const&)::$_0>::operator()
                        ((_Iter_pred<cmake::StringToLogLevel(std::__cxx11::string_const&)::__0> *)
                         &local_168,__it._M_current + 1);
      _Var7._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_001c6576;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmake::StringToLogLevel(std::__cxx11::string_const&)::$_0>::operator()
                        ((_Iter_pred<cmake::StringToLogLevel(std::__cxx11::string_const&)::__0> *)
                         &local_168,__it._M_current + 2);
      _Var7._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_001c6576;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmake::StringToLogLevel(std::__cxx11::string_const&)::$_0>::operator()
                        ((_Iter_pred<cmake::StringToLogLevel(std::__cxx11::string_const&)::__0> *)
                         &local_168,__it._M_current + 3);
      _Var7._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_001c6576;
      __it._M_current = __it._M_current + 4;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = ((long)ppVar1 - (long)__it_00._M_current >> 3) * -0x3333333333333333;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var7._M_current = ppVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<cmake::StringToLogLevel(std::__cxx11::string_const&)::$_0>::operator()
                            ((_Iter_pred<cmake::StringToLogLevel(std::__cxx11::string_const&)::__0>
                              *)&local_168,__it_00), _Var7._M_current = __it_00._M_current, bVar2))
      goto LAB_001c6576;
      __it_00._M_current = __it_00._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmake::StringToLogLevel(std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_pred<cmake::StringToLogLevel(std::__cxx11::string_const&)::__0> *)
                         &local_168,__it_00);
    _Var7._M_current = __it_00._M_current;
    if (bVar2) goto LAB_001c6576;
    __it_00._M_current = __it_00._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::_Iter_pred<cmake::StringToLogLevel(std::__cxx11::string_const&)::$_0>::
          operator()((_Iter_pred<cmake::StringToLogLevel(std::__cxx11::string_const&)::__0> *)
                     &local_168,__it_00);
  _Var7._M_current = __it_00._M_current;
  if (!bVar2) {
    _Var7._M_current = ppVar1;
  }
LAB_001c6576:
  if (_Var7._M_current == ppVar1) {
    LVar4 = LOG_UNDEFINED;
  }
  else {
    LVar4 = (_Var7._M_current)->second;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.first._M_dataplus._M_p != &local_148.first.field_2) {
    operator_delete(local_148.first._M_dataplus._M_p,
                    local_148.first.field_2._M_allocated_capacity + 1);
  }
  return LVar4;
}

Assistant:

cmake::LogLevel cmake::StringToLogLevel(const std::string& levelStr)
{
  using LevelsPair = std::pair<std::string, LogLevel>;
  static const std::vector<LevelsPair> levels = {
    { "error", LogLevel::LOG_ERROR },     { "warning", LogLevel::LOG_WARNING },
    { "notice", LogLevel::LOG_NOTICE },   { "status", LogLevel::LOG_STATUS },
    { "verbose", LogLevel::LOG_VERBOSE }, { "debug", LogLevel::LOG_DEBUG },
    { "trace", LogLevel::LOG_TRACE }
  };

  const auto levelStrLowCase = cmSystemTools::LowerCase(levelStr);

  const auto it = std::find_if(levels.cbegin(), levels.cend(),
                               [&levelStrLowCase](const LevelsPair& p) {
                                 return p.first == levelStrLowCase;
                               });
  return (it != levels.cend()) ? it->second : LogLevel::LOG_UNDEFINED;
}